

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O1

void __thiscall
QRhiGles2::endPass(QRhiGles2 *this,QRhiCommandBuffer *cb,QRhiResourceUpdateBatch *resourceUpdates)

{
  int iVar1;
  int iVar2;
  int iVar3;
  _func_int **pp_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  _func_int *p_Var11;
  ulong uVar12;
  _func_int **pp_Var13;
  _func_int **pp_Var14;
  uint uVar15;
  int iVar16;
  undefined4 uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  undefined4 uVar25;
  _func_int *p_Var26;
  int iVar27;
  QGles2RenderBuffer *rbD;
  long in_FS_OFFSET;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar10 = (**(code **)(*cb[5].super_QRhiResource._vptr_QRhiResource + 0x10))();
  if (iVar10 == 6) {
    pp_Var4 = cb[5].super_QRhiResource._vptr_QRhiResource;
    if (pp_Var4[8] != (_func_int *)0x0) {
      p_Var26 = pp_Var4[9];
      p_Var11 = p_Var26 + (long)pp_Var4[8] * 0x30;
      do {
        lVar21 = *(long *)(p_Var26 + 0x18);
        if (lVar21 != 0) {
          lVar22 = *(long *)(p_Var26 + 8);
          iVar10 = (int)*(undefined8 *)(lVar21 + 0x34);
          iVar24 = (int)((ulong)*(undefined8 *)(lVar21 + 0x34) >> 0x20);
          if (lVar22 == 0) {
            if (((this->caps).field_0x3d & 1) == 0) {
              lVar22 = *(long *)p_Var26;
              if (((int)*(undefined8 *)(lVar22 + 0x34) != iVar10) ||
                 ((int)((ulong)*(undefined8 *)(lVar22 + 0x34) >> 0x20) != iVar24)) {
                local_58[0] = '\x02';
                local_58[1] = '\0';
                local_58[2] = '\0';
                local_58[3] = '\0';
                local_58[4] = '\0';
                local_58[5] = '\0';
                local_58[6] = '\0';
                local_58[7] = '\0';
                local_58[8] = '\0';
                local_58[9] = '\0';
                local_58[10] = '\0';
                local_58[0xb] = '\0';
                local_58[0xc] = '\0';
                local_58[0xd] = '\0';
                local_58[0xe] = '\0';
                local_58[0xf] = '\0';
                local_58[0x10] = '\0';
                local_58[0x11] = '\0';
                local_58[0x12] = '\0';
                local_58[0x13] = '\0';
                local_58[0x14] = '\0';
                local_58[0x15] = '\0';
                local_58[0x16] = '\0';
                local_58[0x17] = '\0';
                local_40 = "default";
                QMessageLogger::warning
                          (local_58,"Resolve source (%dx%d) and target (%dx%d) size does not match")
                ;
              }
              iVar1 = *(int *)(p_Var26 + 0x28);
              if (*(int *)(p_Var26 + 0x28) < 2) {
                iVar1 = 1;
              }
              iVar27 = 0;
              do {
                iVar16 = *(int *)(p_Var26 + 0x10);
                iVar2 = *(int *)(p_Var26 + 0x20);
                iVar23 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
                iVar3 = *(int *)&cb[1].super_QRhiResource.m_rhi;
                if (iVar23 == iVar3) {
                  uVar18 = (long)iVar3 + 0x400;
                  auVar6._8_8_ = 0;
                  auVar6._0_8_ = uVar18;
                  uVar12 = SUB168(auVar6 * ZEXT816(0x68),0);
                  *(int *)&cb[1].super_QRhiResource.m_rhi = (int)uVar18;
                  if (SUB168(auVar6 * ZEXT816(0x68),8) != 0) {
                    uVar12 = 0xffffffffffffffff;
                  }
                  pp_Var13 = (_func_int **)operator_new__(uVar12);
                  pp_Var14 = cb[1].super_QRhiResource._vptr_QRhiResource;
                  if (pp_Var14 != (_func_int **)0x0) {
                    memcpy(pp_Var13,pp_Var14,(long)iVar23 * 0x68);
                    operator_delete__(pp_Var14);
                  }
                  cb[1].super_QRhiResource._vptr_QRhiResource = pp_Var13;
                }
                pp_Var14 = cb[1].super_QRhiResource._vptr_QRhiResource;
                iVar23 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
                lVar19 = (long)iVar23;
                *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4) = iVar23 + 1;
                *(undefined4 *)(pp_Var14 + lVar19 * 0xd) = 0x17;
                if ((*(byte *)(lVar22 + 0x48) & 4) == 0) {
                  iVar23 = *(int *)(lVar22 + 0x6c);
                }
                else {
                  iVar23 = iVar27 + iVar16 + 0x8515;
                }
                *(int *)(pp_Var14 + lVar19 * 0xd + 1) = iVar23;
                *(undefined4 *)((long)pp_Var14 + lVar19 * 0x68 + 0xc) =
                     *(undefined4 *)(lVar22 + 100);
                *(undefined4 *)(pp_Var14 + lVar19 * 0xd + 2) = *(undefined4 *)(p_Var26 + 0x14);
                *(undefined4 *)((long)pp_Var14 + lVar19 * 0x68 + 0x14) = 0;
                uVar15 = *(uint *)(lVar22 + 0x48) & 0x1400;
                if (uVar15 != 0) {
                  uVar15 = iVar16 + iVar27;
                }
                *(uint *)((long)pp_Var14 + lVar19 * 0x68 + 0x14) = uVar15;
                *(int *)(pp_Var14 + lVar19 * 0xd + 3) = iVar10;
                *(int *)((long)pp_Var14 + lVar19 * 0x68 + 0x1c) = iVar24;
                if ((*(byte *)(lVar21 + 0x48) & 4) == 0) {
                  iVar16 = *(int *)(lVar21 + 0x6c);
                }
                else {
                  iVar16 = iVar27 + iVar2 + 0x8515;
                }
                *(int *)(pp_Var14 + lVar19 * 0xd + 4) = iVar16;
                *(undefined4 *)((long)pp_Var14 + lVar19 * 0x68 + 0x24) =
                     *(undefined4 *)(lVar21 + 100);
                *(undefined4 *)(pp_Var14 + lVar19 * 0xd + 5) = *(undefined4 *)(p_Var26 + 0x24);
                *(undefined4 *)((long)pp_Var14 + lVar19 * 0x68 + 0x2c) = 0;
                uVar15 = *(uint *)(lVar21 + 0x48) & 0x1400;
                if (uVar15 != 0) {
                  uVar15 = iVar2 + iVar27;
                }
                *(uint *)((long)pp_Var14 + lVar19 * 0x68 + 0x2c) = uVar15;
                *(undefined1 *)(pp_Var14 + lVar19 * 0xd + 6) = 0;
                iVar27 = iVar27 + 1;
              } while (iVar1 != iVar27);
            }
          }
          else {
            if (((int)*(undefined8 *)(lVar22 + 0x34) != iVar10) ||
               ((int)((ulong)*(undefined8 *)(lVar22 + 0x34) >> 0x20) != iVar24)) {
              local_58[0] = '\x02';
              local_58[1] = '\0';
              local_58[2] = '\0';
              local_58[3] = '\0';
              local_58[4] = '\0';
              local_58[5] = '\0';
              local_58[6] = '\0';
              local_58[7] = '\0';
              local_58[8] = '\0';
              local_58[9] = '\0';
              local_58[10] = '\0';
              local_58[0xb] = '\0';
              local_58[0xc] = '\0';
              local_58[0xd] = '\0';
              local_58[0xe] = '\0';
              local_58[0xf] = '\0';
              local_58[0x10] = '\0';
              local_58[0x11] = '\0';
              local_58[0x12] = '\0';
              local_58[0x13] = '\0';
              local_58[0x14] = '\0';
              local_58[0x15] = '\0';
              local_58[0x16] = '\0';
              local_58[0x17] = '\0';
              local_40 = "default";
              QMessageLogger::warning
                        (local_58,"Resolve source (%dx%d) and target (%dx%d) size does not match");
            }
            if (((this->caps).field_0x3d & 1) == 0) {
              iVar1 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
              iVar27 = *(int *)&cb[1].super_QRhiResource.m_rhi;
              if (iVar1 == iVar27) {
                uVar18 = (long)iVar27 + 0x400;
                auVar5._8_8_ = 0;
                auVar5._0_8_ = uVar18;
                uVar12 = SUB168(auVar5 * ZEXT816(0x68),0);
                *(int *)&cb[1].super_QRhiResource.m_rhi = (int)uVar18;
                if (SUB168(auVar5 * ZEXT816(0x68),8) != 0) {
                  uVar12 = 0xffffffffffffffff;
                }
                pp_Var13 = (_func_int **)operator_new__(uVar12);
                pp_Var14 = cb[1].super_QRhiResource._vptr_QRhiResource;
                if (pp_Var14 != (_func_int **)0x0) {
                  memcpy(pp_Var13,pp_Var14,(long)iVar1 * 0x68);
                  operator_delete__(pp_Var14);
                }
                cb[1].super_QRhiResource._vptr_QRhiResource = pp_Var13;
              }
              pp_Var14 = cb[1].super_QRhiResource._vptr_QRhiResource;
              iVar1 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
              lVar19 = (long)iVar1;
              *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4) = iVar1 + 1;
              lVar20 = lVar19 * 0x68;
              *(undefined4 *)(pp_Var14 + lVar19 * 0xd) = 0x16;
              *(undefined4 *)(pp_Var14 + lVar19 * 0xd + 1) = *(undefined4 *)(lVar22 + 0x48);
              *(int *)((long)pp_Var14 + lVar20 + 0xc) = iVar10;
              *(int *)(pp_Var14 + lVar19 * 0xd + 2) = iVar24;
              if ((*(byte *)(lVar21 + 0x48) & 4) == 0) {
                iVar10 = *(int *)(lVar21 + 0x6c);
              }
              else {
                iVar10 = *(int *)(p_Var26 + 0x20) + 0x8515;
              }
              *(int *)((long)pp_Var14 + lVar20 + 0x14) = iVar10;
              *(undefined4 *)(pp_Var14 + lVar19 * 0xd + 3) = *(undefined4 *)(lVar21 + 100);
              *(undefined4 *)((long)pp_Var14 + lVar20 + 0x1c) = *(undefined4 *)(p_Var26 + 0x24);
              if ((*(byte *)(lVar21 + 0x49) & 0x14) == 0) {
                uVar17 = 0;
              }
              else {
                uVar17 = *(undefined4 *)(p_Var26 + 0x20);
              }
              *(undefined4 *)(pp_Var14 + lVar19 * 0xd + 4) = uVar17;
              *(undefined1 *)((long)pp_Var14 + lVar20 + 0x24) = 0;
            }
          }
        }
        p_Var26 = p_Var26 + 0x30;
      } while (p_Var26 != p_Var11);
    }
    p_Var26 = pp_Var4[0x3c];
    if (p_Var26 != (_func_int *)0x0) {
      p_Var11 = pp_Var4[0x3a];
      uVar17 = (undefined4)*(undefined8 *)(p_Var26 + 0x34);
      uVar25 = (undefined4)((ulong)*(undefined8 *)(p_Var26 + 0x34) >> 0x20);
      if (p_Var11 == (_func_int *)0x0) {
        if (((this->caps).field_0x3d & 1) == 0) {
          p_Var11 = pp_Var4[0x3b];
          iVar10 = 1;
          if (1 < *(int *)(p_Var11 + 0x40)) {
            iVar10 = *(int *)(p_Var11 + 0x40);
          }
          iVar24 = 0;
          do {
            iVar1 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
            iVar27 = *(int *)&cb[1].super_QRhiResource.m_rhi;
            if (iVar1 == iVar27) {
              uVar18 = (long)iVar27 + 0x400;
              auVar8._8_8_ = 0;
              auVar8._0_8_ = uVar18;
              uVar12 = SUB168(auVar8 * ZEXT816(0x68),0);
              *(int *)&cb[1].super_QRhiResource.m_rhi = (int)uVar18;
              if (SUB168(auVar8 * ZEXT816(0x68),8) != 0) {
                uVar12 = 0xffffffffffffffff;
              }
              pp_Var13 = (_func_int **)operator_new__(uVar12);
              pp_Var14 = cb[1].super_QRhiResource._vptr_QRhiResource;
              if (pp_Var14 != (_func_int **)0x0) {
                memcpy(pp_Var13,pp_Var14,(long)iVar1 * 0x68);
                operator_delete__(pp_Var14);
              }
              cb[1].super_QRhiResource._vptr_QRhiResource = pp_Var13;
            }
            pp_Var14 = cb[1].super_QRhiResource._vptr_QRhiResource;
            iVar1 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
            lVar21 = (long)iVar1;
            *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4) = iVar1 + 1;
            lVar22 = lVar21 * 0x68;
            *(undefined4 *)(pp_Var14 + lVar21 * 0xd) = 0x17;
            *(undefined4 *)(pp_Var14 + lVar21 * 0xd + 1) = *(undefined4 *)(p_Var11 + 0x6c);
            *(undefined4 *)((long)pp_Var14 + lVar22 + 0xc) = *(undefined4 *)(p_Var11 + 100);
            *(undefined4 *)(pp_Var14 + lVar21 * 0xd + 2) = 0;
            *(int *)((long)pp_Var14 + lVar22 + 0x14) = iVar24;
            *(undefined4 *)(pp_Var14 + lVar21 * 0xd + 3) = uVar17;
            *(undefined4 *)((long)pp_Var14 + lVar22 + 0x1c) = uVar25;
            *(undefined4 *)(pp_Var14 + lVar21 * 0xd + 4) = *(undefined4 *)(p_Var26 + 0x6c);
            *(undefined4 *)((long)pp_Var14 + lVar22 + 0x24) = *(undefined4 *)(p_Var26 + 100);
            *(undefined4 *)(pp_Var14 + lVar21 * 0xd + 5) = 0;
            *(int *)((long)pp_Var14 + lVar22 + 0x2c) = iVar24;
            *(undefined1 *)(pp_Var14 + lVar21 * 0xd + 6) = 1;
            iVar24 = iVar24 + 1;
          } while (iVar10 != iVar24);
        }
      }
      else {
        iVar10 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
        iVar24 = *(int *)&cb[1].super_QRhiResource.m_rhi;
        if (iVar10 == iVar24) {
          uVar12 = (long)iVar24 + 0x400;
          *(int *)&cb[1].super_QRhiResource.m_rhi = (int)uVar12;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = uVar12;
          uVar12 = 0xffffffffffffffff;
          if (SUB168(auVar7 * ZEXT816(0x68),8) == 0) {
            uVar12 = SUB168(auVar7 * ZEXT816(0x68),0);
          }
          pp_Var13 = (_func_int **)operator_new__(uVar12);
          pp_Var14 = cb[1].super_QRhiResource._vptr_QRhiResource;
          if (pp_Var14 != (_func_int **)0x0) {
            memcpy(pp_Var13,pp_Var14,(long)iVar10 * 0x68);
            operator_delete__(pp_Var14);
          }
          cb[1].super_QRhiResource._vptr_QRhiResource = pp_Var13;
        }
        pp_Var14 = cb[1].super_QRhiResource._vptr_QRhiResource;
        iVar10 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
        lVar21 = (long)iVar10;
        *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4) = iVar10 + 1;
        lVar22 = lVar21 * 0x68;
        *(undefined4 *)(pp_Var14 + lVar21 * 0xd) = 0x16;
        *(undefined4 *)(pp_Var14 + lVar21 * 0xd + 1) = *(undefined4 *)(p_Var11 + 0x48);
        *(undefined4 *)((long)pp_Var14 + lVar22 + 0xc) = uVar17;
        *(undefined4 *)(pp_Var14 + lVar21 * 0xd + 2) = uVar25;
        *(undefined4 *)((long)pp_Var14 + lVar22 + 0x14) = *(undefined4 *)(p_Var26 + 0x6c);
        *(undefined4 *)(pp_Var14 + lVar21 * 0xd + 3) = *(undefined4 *)(p_Var26 + 100);
        *(undefined8 *)((long)pp_Var14 + lVar22 + 0x1c) = 0;
        *(undefined1 *)((long)pp_Var14 + lVar22 + 0x24) = 1;
      }
    }
    if (((pp_Var4[0x3a] != (_func_int *)0x0) ||
        ((pp_Var4[0x3b] != (_func_int *)0x0 && (((ulong)pp_Var4[0x3e] & 4) != 0)))) &&
       (pp_Var4[0x3c] == (_func_int *)0x0)) {
      iVar10 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
      iVar24 = *(int *)&cb[1].super_QRhiResource.m_rhi;
      if (iVar10 == iVar24) {
        uVar12 = (long)iVar24 + 0x400;
        *(int *)&cb[1].super_QRhiResource.m_rhi = (int)uVar12;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar12;
        uVar12 = 0xffffffffffffffff;
        if (SUB168(auVar9 * ZEXT816(0x68),8) == 0) {
          uVar12 = SUB168(auVar9 * ZEXT816(0x68),0);
        }
        pp_Var14 = (_func_int **)operator_new__(uVar12);
        pp_Var4 = cb[1].super_QRhiResource._vptr_QRhiResource;
        if (pp_Var4 != (_func_int **)0x0) {
          memcpy(pp_Var14,pp_Var4,(long)iVar10 * 0x68);
          operator_delete__(pp_Var4);
        }
        cb[1].super_QRhiResource._vptr_QRhiResource = pp_Var14;
      }
      pp_Var4 = cb[1].super_QRhiResource._vptr_QRhiResource;
      iVar10 = *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4);
      lVar21 = (long)iVar10;
      *(int *)((long)&cb[1].super_QRhiResource.m_rhi + 4) = iVar10 + 1;
      *(undefined4 *)(pp_Var4 + lVar21 * 0xd) = 0x1d;
      if (((this->caps).field_0x39 & 0x40) == 0) {
        pp_Var4[lVar21 * 0xd + 1] = (_func_int *)0x8d0000000002;
        *(undefined4 *)(pp_Var4 + lVar21 * 0xd + 2) = 0x8d20;
      }
      else {
        pp_Var4[lVar21 * 0xd + 1] = (_func_int *)0x821a00000001;
      }
    }
  }
  *(undefined4 *)((long)&cb[4].super_QRhiResource.m_objectName.d.d + 4) = 0;
  cb[5].super_QRhiResource._vptr_QRhiResource = (_func_int **)0x0;
  if (resourceUpdates != (QRhiResourceUpdateBatch *)0x0) {
    enqueueResourceUpdates(this,cb,resourceUpdates);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRhiGles2::endPass(QRhiCommandBuffer *cb, QRhiResourceUpdateBatch *resourceUpdates)
{
    QGles2CommandBuffer *cbD = QRHI_RES(QGles2CommandBuffer, cb);
    Q_ASSERT(cbD->recordingPass == QGles2CommandBuffer::RenderPass);

    if (cbD->currentTarget->resourceType() == QRhiResource::TextureRenderTarget) {
        QGles2TextureRenderTarget *rtTex = QRHI_RES(QGles2TextureRenderTarget, cbD->currentTarget);
        for (auto it = rtTex->m_desc.cbeginColorAttachments(), itEnd = rtTex->m_desc.cendColorAttachments();
             it != itEnd; ++it)
        {
            const QRhiColorAttachment &colorAtt(*it);
            if (!colorAtt.resolveTexture())
                continue;

            QGles2Texture *resolveTexD = QRHI_RES(QGles2Texture, colorAtt.resolveTexture());
            const QSize size = resolveTexD->pixelSize();
            if (colorAtt.renderBuffer()) {
                QGles2RenderBuffer *rbD = QRHI_RES(QGles2RenderBuffer, colorAtt.renderBuffer());
                if (rbD->pixelSize() != size) {
                    qWarning("Resolve source (%dx%d) and target (%dx%d) size does not match",
                             rbD->pixelSize().width(), rbD->pixelSize().height(), size.width(), size.height());
                }
                if (caps.glesMultisampleRenderToTexture) {
                    // colorAtt.renderBuffer() is not actually used for anything if OpenGL ES'
                    // auto-resolving GL_EXT_multisampled_render_to_texture is used.
                } else {
                    QGles2CommandBuffer::Command &cmd(cbD->commands.get());
                    cmd.cmd = QGles2CommandBuffer::Command::BlitFromRenderbuffer;
                    cmd.args.blitFromRenderbuffer.renderbuffer = rbD->renderbuffer;
                    cmd.args.blitFromRenderbuffer.w = size.width();
                    cmd.args.blitFromRenderbuffer.h = size.height();
                    if (resolveTexD->m_flags.testFlag(QRhiTexture::CubeMap))
                        cmd.args.blitFromRenderbuffer.target = GL_TEXTURE_CUBE_MAP_POSITIVE_X + uint(colorAtt.resolveLayer());
                    else
                        cmd.args.blitFromRenderbuffer.target = resolveTexD->target;
                    cmd.args.blitFromRenderbuffer.dstTexture = resolveTexD->texture;
                    cmd.args.blitFromRenderbuffer.dstLevel = colorAtt.resolveLevel();
                    const bool hasZ = resolveTexD->m_flags.testFlag(QRhiTexture::ThreeDimensional)
                        || resolveTexD->m_flags.testFlag(QRhiTexture::TextureArray);
                    cmd.args.blitFromRenderbuffer.dstLayer = hasZ ? colorAtt.resolveLayer() : 0;
                    cmd.args.blitFromRenderbuffer.isDepthStencil = false;
                }
            } else if (caps.glesMultisampleRenderToTexture) {
                // Nothing to do, resolving into colorAtt.resolveTexture() is automatic,
                // colorAtt.texture() is in fact not used for anything.
            } else {
                Q_ASSERT(colorAtt.texture());
                QGles2Texture *texD = QRHI_RES(QGles2Texture, colorAtt.texture());
                if (texD->pixelSize() != size) {
                    qWarning("Resolve source (%dx%d) and target (%dx%d) size does not match",
                             texD->pixelSize().width(), texD->pixelSize().height(), size.width(), size.height());
                }
                const int resolveCount = colorAtt.multiViewCount() >= 2 ? colorAtt.multiViewCount() : 1;
                for (int resolveIdx = 0; resolveIdx < resolveCount; ++resolveIdx) {
                    const int srcLayer = colorAtt.layer() + resolveIdx;
                    const int dstLayer = colorAtt.resolveLayer() + resolveIdx;
                    QGles2CommandBuffer::Command &cmd(cbD->commands.get());
                    cmd.cmd = QGles2CommandBuffer::Command::BlitFromTexture;
                    if (texD->m_flags.testFlag(QRhiTexture::CubeMap))
                        cmd.args.blitFromTexture.srcTarget = GL_TEXTURE_CUBE_MAP_POSITIVE_X + uint(srcLayer);
                    else
                        cmd.args.blitFromTexture.srcTarget = texD->target;
                    cmd.args.blitFromTexture.srcTexture = texD->texture;
                    cmd.args.blitFromTexture.srcLevel = colorAtt.level();
                    cmd.args.blitFromTexture.srcLayer = 0;
                    if (texD->m_flags.testFlag(QRhiTexture::ThreeDimensional) || texD->m_flags.testFlag(QRhiTexture::TextureArray))
                        cmd.args.blitFromTexture.srcLayer = srcLayer;
                    cmd.args.blitFromTexture.w = size.width();
                    cmd.args.blitFromTexture.h = size.height();
                    if (resolveTexD->m_flags.testFlag(QRhiTexture::CubeMap))
                        cmd.args.blitFromTexture.dstTarget = GL_TEXTURE_CUBE_MAP_POSITIVE_X + uint(dstLayer);
                    else
                        cmd.args.blitFromTexture.dstTarget = resolveTexD->target;
                    cmd.args.blitFromTexture.dstTexture = resolveTexD->texture;
                    cmd.args.blitFromTexture.dstLevel = colorAtt.resolveLevel();
                    cmd.args.blitFromTexture.dstLayer = 0;
                    if (resolveTexD->m_flags.testFlag(QRhiTexture::ThreeDimensional) || resolveTexD->m_flags.testFlag(QRhiTexture::TextureArray))
                        cmd.args.blitFromTexture.dstLayer = dstLayer;
                    cmd.args.blitFromTexture.isDepthStencil = false;
                }
            }
        }

        if (rtTex->m_desc.depthResolveTexture()) {
            QGles2Texture *depthResolveTexD = QRHI_RES(QGles2Texture, rtTex->m_desc.depthResolveTexture());
            const QSize size = depthResolveTexD->pixelSize();
            if (rtTex->m_desc.depthStencilBuffer()) {
                QGles2RenderBuffer *rbD = QRHI_RES(QGles2RenderBuffer, rtTex->m_desc.depthStencilBuffer());
                QGles2CommandBuffer::Command &cmd(cbD->commands.get());
                cmd.cmd = QGles2CommandBuffer::Command::BlitFromRenderbuffer;
                cmd.args.blitFromRenderbuffer.renderbuffer = rbD->renderbuffer;
                cmd.args.blitFromRenderbuffer.w = size.width();
                cmd.args.blitFromRenderbuffer.h = size.height();
                cmd.args.blitFromRenderbuffer.target = depthResolveTexD->target;
                cmd.args.blitFromRenderbuffer.dstTexture = depthResolveTexD->texture;
                cmd.args.blitFromRenderbuffer.dstLevel = 0;
                cmd.args.blitFromRenderbuffer.dstLayer = 0;
                cmd.args.blitFromRenderbuffer.isDepthStencil = true;
            } else if (caps.glesMultisampleRenderToTexture) {
                // Nothing to do, resolving into depthResolveTexture() is automatic.
            } else {
                QGles2Texture *depthTexD = QRHI_RES(QGles2Texture, rtTex->m_desc.depthTexture());
                const int resolveCount = depthTexD->arraySize() >= 2 ? depthTexD->arraySize() : 1;
                for (int resolveIdx = 0; resolveIdx < resolveCount; ++resolveIdx) {
                    QGles2CommandBuffer::Command &cmd(cbD->commands.get());
                    cmd.cmd = QGles2CommandBuffer::Command::BlitFromTexture;
                    cmd.args.blitFromTexture.srcTarget = depthTexD->target;
                    cmd.args.blitFromTexture.srcTexture = depthTexD->texture;
                    cmd.args.blitFromTexture.srcLevel = 0;
                    cmd.args.blitFromTexture.srcLayer = resolveIdx;
                    cmd.args.blitFromTexture.w = size.width();
                    cmd.args.blitFromTexture.h = size.height();
                    cmd.args.blitFromTexture.dstTarget = depthResolveTexD->target;
                    cmd.args.blitFromTexture.dstTexture = depthResolveTexD->texture;
                    cmd.args.blitFromTexture.dstLevel = 0;
                    cmd.args.blitFromTexture.dstLayer = resolveIdx;
                    cmd.args.blitFromTexture.isDepthStencil = true;
                }
            }
        }

        const bool mayDiscardDepthStencil =
            (rtTex->m_desc.depthStencilBuffer()
             || (rtTex->m_desc.depthTexture() && rtTex->m_flags.testFlag(QRhiTextureRenderTarget::DoNotStoreDepthStencilContents)))
            && !rtTex->m_desc.depthResolveTexture();
        if (mayDiscardDepthStencil) {
            QGles2CommandBuffer::Command &cmd(cbD->commands.get());
            cmd.cmd = QGles2CommandBuffer::Command::InvalidateFramebuffer;
            if (caps.needsDepthStencilCombinedAttach) {
                cmd.args.invalidateFramebuffer.attCount = 1;
                cmd.args.invalidateFramebuffer.att[0] = GL_DEPTH_STENCIL_ATTACHMENT;
            } else {
                cmd.args.invalidateFramebuffer.attCount = 2;
                cmd.args.invalidateFramebuffer.att[0] = GL_DEPTH_ATTACHMENT;
                cmd.args.invalidateFramebuffer.att[1] = GL_STENCIL_ATTACHMENT;
            }
        }
    }

    cbD->recordingPass = QGles2CommandBuffer::NoPass;
    cbD->currentTarget = nullptr;

    if (resourceUpdates)
        enqueueResourceUpdates(cb, resourceUpdates);
}